

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::parse(Forth *this)

{
  bool bVar1;
  bool bVar2;
  byte __c;
  uint uVar3;
  int iVar4;
  Cell CVar5;
  Cell CVar6;
  size_t sVar7;
  size_type sVar8;
  uint local_58;
  size_t dataInDataSpace_;
  Char ch;
  bool flag;
  undefined1 local_38 [7];
  bool exits;
  string parseBuffer;
  char delim;
  Forth *this_local;
  
  requireDStackDepth(this,1,"PARSE");
  requireDStackAvailable(this,1,"PARSE");
  uVar3 = ForthStack<unsigned_int>::getTop(&this->dStack);
  parseBuffer.field_2._M_local_buf[0xf] = (char)uVar3;
  std::__cxx11::string::string((string *)local_38);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::clear
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  bVar1 = false;
  do {
    if (bVar1) {
      sVar7 = PutStringToEndOfDataSpace(this,(string *)local_38);
      local_58 = (uint)sVar7;
      ForthStack<unsigned_int>::setTop(&this->dStack,local_58);
      sVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_38);
      push(this,(Cell)sVar8);
      std::__cxx11::string::~string((string *)local_38);
      return;
    }
    while (iVar4 = getSourceBufferRemain(this), iVar4 == 0) {
      if (parseBuffer.field_2._M_local_buf[0xf] != ')') {
        bVar1 = true;
        break;
      }
      bVar2 = refillNextLine(this);
      if (!bVar2) {
        bVar1 = true;
      }
    }
    iVar4 = getSourceBufferRemain(this);
    if (0 < iVar4) {
      CVar5 = getSourceAddress(this);
      CVar6 = getSourceBufferOffset(this);
      __c = getDataChar(this,CVar5 + CVar6);
      incSourceBufferOffset(this);
      if (((parseBuffer.field_2._M_local_buf[0xf] == ' ') &&
          (iVar4 = isspace((uint)__c), iVar4 != 0)) ||
         ((int)parseBuffer.field_2._M_local_buf[0xf] == (uint)__c)) {
        bVar1 = true;
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,__c
                  );
      }
    }
  } while( true );
}

Assistant:

void parse() {
			REQUIRE_DSTACK_DEPTH(1, "PARSE");
			REQUIRE_DSTACK_AVAILABLE(1, "PARSE");

			auto delim = static_cast<char>(dStack.getTop());
			/****

			I need a buffer to store the result of the Forth `PARSE` word.  Unlike `WORD`,
			this is a "normal" string and I won't need to store the count at the beginning
			of this buffer.

			****/

			std::string parseBuffer{};
			parseBuffer.clear();
			// Copy characters until we see the delimiter.

			bool exits{ false };
			while (!exits){
				while (getSourceBufferRemain()==0){ 
					// load next string from input buffer
					if (delim == ')') {
						auto flag=refillNextLine();
						if (!flag) {
							exits = true;							
						}
					}
					else {
						exits = true;
						break;
					}
				}
				if (getSourceBufferRemain() > 0) {
					// next char
					auto ch = getDataChar(getSourceAddress() + getSourceBufferOffset());
					incSourceBufferOffset();
					if ((delim == ' ' && isspace(static_cast<unsigned char>(ch))) || (delim == ch)) {
						exits = true;
					}
					else {
						parseBuffer.push_back(ch);
					}
				}
			}
			auto dataInDataSpace_ = PutStringToEndOfDataSpace(parseBuffer);

			dStack.setTop(CELL(dataInDataSpace_));
			push(static_cast<Cell>(parseBuffer.size()));
		}